

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayConstraintGraph(cmComputeLinkDepends *this)

{
  pointer pcVar1;
  string_view sep;
  FILE *__stream;
  ostream *poVar2;
  uint uVar3;
  ulong uVar4;
  string_view prefix;
  string_view suffix;
  string local_1c8;
  ostringstream e;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  uVar3 = 0;
  while( true ) {
    __stream = _stderr;
    uVar4 = (ulong)uVar3;
    pcVar1 = (this->EntryConstraintGraph).
             super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
             super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->EntryConstraintGraph).
                       super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                       super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl
                       .super__Vector_impl_data._M_finish - (long)pcVar1) / 0x18) <= uVar4) break;
    poVar2 = std::operator<<((ostream *)&e,"item ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2," is [");
    poVar2 = ::operator<<(poVar2,&(this->EntryList).
                                  super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar4].Item);
    std::operator<<(poVar2,"]\n");
    sep._M_str = "\n";
    sep._M_len = 1;
    prefix._M_str = "  item ";
    prefix._M_len = 7;
    suffix._M_str = " must follow it";
    suffix._M_len = 0xf;
    cmWrap<cmGraphEdgeList>(&local_1c8,prefix,pcVar1 + uVar4,suffix,sep);
    poVar2 = std::operator<<((ostream *)&e,(string *)&local_1c8);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    uVar3 = uVar3 + 1;
  }
  std::__cxx11::stringbuf::str();
  fprintf(__stream,"%s\n",local_1c8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayConstraintGraph()
{
  // Display the graph nodes and their edges.
  std::ostringstream e;
  for (unsigned int i = 0; i < this->EntryConstraintGraph.size(); ++i) {
    EdgeList const& nl = this->EntryConstraintGraph[i];
    e << "item " << i << " is [" << this->EntryList[i].Item << "]\n";
    e << cmWrap("  item ", nl, " must follow it", "\n") << "\n";
  }
  fprintf(stderr, "%s\n", e.str().c_str());
}